

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
write_padded<fmt::v6::internal::nonfinite_writer<char>>
          (basic_writer<fmt::v6::buffer_range<char>> *this,format_specs *specs,
          nonfinite_writer<char> *f)

{
  fill_t<char> *fill;
  undefined2 uVar1;
  type tVar2;
  checked_ptr<typename_buffer<char>::value_type> it;
  char *pcVar3;
  byte bVar4;
  ulong uVar5;
  size_t n;
  
  tVar2 = to_unsigned<int>(specs->width);
  uVar5 = 4 - (ulong)(f->sign == none);
  n = tVar2 - uVar5;
  if (tVar2 < uVar5 || n == 0) {
    pcVar3 = reserve<fmt::v6::internal::buffer<char>,_0>
                       ((back_insert_iterator<fmt::v6::internal::buffer<char>_> *)this,uVar5);
LAB_00159543:
    if ((ulong)f->sign != 0) {
      *pcVar3 = *(char *)((long)&basic_data<void>::signs + (ulong)f->sign);
      pcVar3 = pcVar3 + 1;
    }
    uVar1 = *(undefined2 *)f->str;
    pcVar3[2] = f->str[2];
    *(undefined2 *)pcVar3 = uVar1;
    return;
  }
  fill = &specs->fill;
  it = reserve<fmt::v6::internal::buffer<char>,_0>
                 ((back_insert_iterator<fmt::v6::internal::buffer<char>_> *)this,
                  (specs->fill).size_ * n + uVar5);
  bVar4 = specs->field_0x9 & 0xf;
  if (bVar4 == 3) {
    uVar5 = n >> 1 & 0x7fffffff;
    it = fill<char*,char>(it,uVar5,fill);
    if ((ulong)f->sign != 0) {
      *it = *(char *)((long)&basic_data<void>::signs + (ulong)f->sign);
      it = it + 1;
    }
    uVar1 = *(undefined2 *)f->str;
    it[2] = f->str[2];
    *(undefined2 *)it = uVar1;
    n = n - uVar5;
  }
  else {
    if (bVar4 == 2) {
      pcVar3 = fill<char*,char>(it,n,fill);
      goto LAB_00159543;
    }
    if ((ulong)f->sign != 0) {
      *it = *(char *)((long)&basic_data<void>::signs + (ulong)f->sign);
      it = it + 1;
    }
    uVar1 = *(undefined2 *)f->str;
    it[2] = f->str[2];
    *(undefined2 *)it = uVar1;
  }
  fill<char*,char>(it + 3,n,fill);
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    size_t padding = width - num_code_points;
    size_t fill_size = specs.fill.size();
    auto&& it = reserve(size + padding * fill_size);
    if (specs.align == align::right) {
      it = fill(it, padding, specs.fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = fill(it, left_padding, specs.fill);
      f(it);
      it = fill(it, padding - left_padding, specs.fill);
    } else {
      f(it);
      it = fill(it, padding, specs.fill);
    }
  }